

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall
capnp::compiler::Compiler::Impl::eagerlyCompile
          (Impl *this,uint64_t id,uint eagerness,SchemaLoader *finalLoader)

{
  size_t amount;
  Reader *pRVar1;
  RemoveConst<capnp::schema::Node::SourceInfo::Reader> *pRVar2;
  Reader *pRVar3;
  iterator iVar4;
  WirePointer *reader;
  size_t sVar5;
  Vector<capnp::schema::Node::SourceInfo::Reader> *__range3;
  undefined8 uVar6;
  Reader *sourceInfo;
  StructReader *this_00;
  MessageSizeCounts MVar7;
  ArrayPtr<capnp::word> uncheckedBuffer;
  Vector<capnp::schema::Node::SourceInfo::Reader> sourceInfos;
  uint64_t id_local;
  PointerReader local_f8;
  unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
  seen;
  StructReader local_98;
  undefined8 local_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  StructDataBitCount local_40;
  StructPointerCount SStack_3c;
  undefined2 uStack_3a;
  int iStack_38;
  undefined4 uStack_34;
  
  id_local = id;
  seen._M_h._M_buckets = (__buckets_ptr)id;
  iVar4 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->nodesById)._M_h,(key_type *)&seen);
  if ((iVar4.
       super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (*(Node **)((long)iVar4.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
                       ._M_cur + 0x10) != (Node *)0x0)) {
    seen._M_h._M_buckets = &seen._M_h._M_single_bucket;
    seen._M_h._M_bucket_count = 1;
    seen._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    seen._M_h._M_element_count = 0;
    seen._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    seen._M_h._M_rehash_policy._M_next_resize = 0;
    seen._M_h._M_single_bucket = (__node_base_ptr)0x0;
    sourceInfos.builder.ptr = (Reader *)0x0;
    sourceInfos.builder.pos = (RemoveConst<capnp::schema::Node::SourceInfo::Reader> *)0x0;
    sourceInfos.builder.endPtr = (Reader *)0x0;
    Node::traverse(*(Node **)((long)iVar4.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
                                    ._M_cur + 0x10),eagerness,&seen,finalLoader,&sourceInfos);
    pRVar2 = sourceInfos.builder.pos;
    if (sourceInfos.builder.ptr != sourceInfos.builder.pos) {
      this_00 = &(sourceInfos.builder.ptr)->_reader;
      do {
        MVar7 = capnp::_::StructReader::totalSize(this_00);
        amount = MVar7.wordCount * 8 + 8;
        sVar5 = 0;
        reader = (WirePointer *)kj::Arena::allocateBytes(&this->nodeArena,amount,8,false);
        memset(reader,0,amount);
        uncheckedBuffer.size_ = sVar5;
        uncheckedBuffer.ptr = (word *)(MVar7.wordCount + 1);
        copyToUnchecked<capnp::schema::Node::SourceInfo::Reader&>
                  ((capnp *)this_00,(Reader *)reader,uncheckedBuffer);
        if (this_00->dataSize < 0x40) {
          uVar6 = 0;
        }
        else {
          uVar6 = *this_00->data;
        }
        local_f8.segment = (SegmentReader *)0x0;
        local_f8.capTable = (CapTableReader *)0x0;
        local_f8.nestingLimit = 0x7fffffff;
        local_f8.pointer = reader;
        capnp::_::PointerReader::getStruct(&local_98,&local_f8,(word *)0x0);
        local_40 = local_98.dataSize;
        SStack_3c = local_98.pointerCount;
        uStack_3a = local_98._38_2_;
        iStack_38 = local_98.nestingLimit;
        uStack_34 = local_98._44_4_;
        local_50 = local_98.data._0_4_;
        uStack_4c = local_98.data._4_4_;
        uStack_48 = local_98.pointers._0_4_;
        uStack_44 = local_98.pointers._4_4_;
        local_60 = local_98.segment._0_4_;
        uStack_5c = local_98.segment._4_4_;
        uStack_58 = local_98.capTable._0_4_;
        uStack_54 = local_98.capTable._4_4_;
        local_68 = uVar6;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,capnp::schema::Node::SourceInfo::Reader>,std::allocator<std::pair<unsigned_long_const,capnp::schema::Node::SourceInfo::Reader>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,capnp::schema::Node::SourceInfo::Reader>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,capnp::schema::Node::SourceInfo::Reader>,std::allocator<std::pair<unsigned_long_const,capnp::schema::Node::SourceInfo::Reader>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->sourceInfoById,&local_68);
        this_00 = this_00 + 1;
      } while (this_00 != &pRVar2->_reader);
    }
    pRVar3 = sourceInfos.builder.endPtr;
    pRVar2 = sourceInfos.builder.pos;
    pRVar1 = sourceInfos.builder.ptr;
    if (sourceInfos.builder.ptr != (Reader *)0x0) {
      sourceInfos.builder.ptr = (Reader *)0x0;
      sourceInfos.builder.pos = (RemoveConst<capnp::schema::Node::SourceInfo::Reader> *)0x0;
      sourceInfos.builder.endPtr = (Reader *)0x0;
      (**(sourceInfos.builder.disposer)->_vptr_ArrayDisposer)
                (sourceInfos.builder.disposer,pRVar1,0x30,
                 ((long)pRVar2 - (long)pRVar1 >> 4) * -0x5555555555555555,
                 ((long)pRVar3 - (long)pRVar1 >> 4) * -0x5555555555555555,0);
    }
    std::
    _Hashtable<capnp::compiler::Compiler::Node_*,_std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::hash<capnp::compiler::Compiler::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&seen._M_h);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36],unsigned_long&>
            ((Fault *)&seen,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x50f,FAILED,(char *)0x0,"\"id did not come from this Compiler.\", id",
             (char (*) [36])"id did not come from this Compiler.",&id_local);
  kj::_::Debug::Fault::fatal((Fault *)&seen);
}

Assistant:

void Compiler::Impl::eagerlyCompile(uint64_t id, uint eagerness,
                                    const SchemaLoader& finalLoader) {
  KJ_IF_MAYBE(node, findNode(id)) {
    std::unordered_map<Node*, uint> seen;
    kj::Vector<schema::Node::SourceInfo::Reader> sourceInfos;
    node->traverse(eagerness, seen, finalLoader, sourceInfos);

    // Copy the SourceInfo structures into permanent space so that they aren't invalidated when
    // clearWorkspace() is called.
    for (auto& sourceInfo: sourceInfos) {
      auto words = nodeArena.allocateArray<word>(sourceInfo.totalSize().wordCount + 1);
      memset(words.begin(), 0, words.asBytes().size());
      copyToUnchecked(sourceInfo, words);
      sourceInfoById.insert(std::make_pair(sourceInfo.getId(),
          readMessageUnchecked<schema::Node::SourceInfo>(words.begin())));
    }
  } else {
    KJ_FAIL_REQUIRE("id did not come from this Compiler.", id);
  }
}